

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O2

optional<tinyusdz::Prim> * __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstructPrimFromTypeName
          (optional<tinyusdz::Prim> *__return_storage_ptr__,Impl *this,string *typeName,
          string *primTypeName,string *prim_name,Node *node,Specifier spec,
          vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *primChildren,
          vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *properties,
          PathIndexToSpecIndexMap *psmap,PrimMeta *meta,bool *is_unsupported_prim)

{
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *pvVar1;
  PathIndexToSpecIndexMap *psmap_00;
  bool *pbVar2;
  bool bVar3;
  __type _Var4;
  ostream *poVar5;
  PrimMeta *pPVar6;
  Prim prim;
  Model typed_prim;
  string local_4d18;
  undefined1 local_4cf8 [848];
  undefined1 local_49a8 [160];
  string local_4908 [32];
  storage_t<double> local_48e8 [5];
  string local_48c0 [1560];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_42a8;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_4290 [7];
  undefined1 local_41e8 [568];
  string local_3fb0 [16];
  undefined1 local_3fa0 [32];
  undefined1 local_3f80 [112];
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_3f10 [6];
  undefined1 local_3df0 [728];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_3b18;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_3b00 [7];
  undefined1 local_3a58 [120];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_39e0 [12];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_38b8;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_38a0 [2];
  undefined1 local_3868 [544];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_3648 [19];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_3470;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_3458 [29];
  undefined1 local_31a0 [704];
  undefined1 local_2ee0 [336];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_2d90 [12];
  undefined1 local_2c68 [224];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_2b88 [6];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_2ae8;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_2ad0 [25];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_2870;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_2858 [428];
  
  pbVar2 = is_unsupported_prim;
  psmap_00 = psmap;
  if (is_unsupported_prim != (bool *)0x0) {
    *is_unsupported_prim = false;
  }
  bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            typeName,"Model");
  if ((bVar3) ||
     (bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )typeName,"__AnyType__"), bVar3)) {
    Model::Model((Model *)local_49a8);
    bVar3 = ReconstructPrim<tinyusdz::Model>(this,&spec,node,psmap_00,(Model *)local_49a8);
    if (!bVar3) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
      poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x70b);
      ::std::operator<<(poVar5," ");
      poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Model");
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_4d18);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
      goto LAB_00151f60;
    }
    PrimMetas::operator=((PrimMetas *)local_3f80,meta);
    ::std::__cxx11::string::_M_assign((string *)(local_41e8 + 0x218));
    bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              typeName,"__AnyType__");
    if (bVar3) {
      ::std::__cxx11::string::assign((char *)local_3fb0);
    }
    else {
      ::std::__cxx11::string::_M_assign(local_3fb0);
    }
    local_3fa0._16_4_ = spec;
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              (local_3b00,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
    pvVar1 = primChildren;
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              (&local_3b18,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren
              );
    linb::any::construct<tinyusdz::Model_const&>((any *)&local_4d18,(Model *)local_49a8);
    Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
    ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
    pPVar6 = Prim::metas((Prim *)local_4cf8);
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              (&pPVar6->primChildren,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
  }
  else {
    tinyusdz::value::TypeTraits<tinyusdz::Xform>::type_name_abi_cxx11_();
    _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_49a8);
    ::std::__cxx11::string::_M_dispose();
    if (_Var4) {
      GPrim::GPrim((GPrim *)local_49a8);
      bVar3 = ReconstructPrim<tinyusdz::Xform>(this,&spec,node,psmap_00,(Xform *)local_49a8);
      if (bVar3) {
        PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
        ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
        local_3f10[0]._0_4_ = spec;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (local_2b88,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
        pvVar1 = primChildren;
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200),
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
        linb::any::construct<tinyusdz::Xform_const&>((any *)&local_4d18,(Xform *)local_49a8);
        Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
        ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
        pPVar6 = Prim::metas((Prim *)local_4cf8);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (&pPVar6->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                  (__return_storage_ptr__,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if (local_4d18.field_2._M_allocated_capacity != 0) {
          (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x720);
        ::std::operator<<(poVar5," ");
        poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
        poVar5 = ::std::operator<<(poVar5,(string *)typeName);
        poVar5 = ::std::operator<<(poVar5," elementName: ");
        poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::stringbuf::str();
        PushError(this,&local_4d18);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      GPrim::~GPrim((GPrim *)local_49a8);
      return __return_storage_ptr__;
    }
    tinyusdz::value::TypeTraits<tinyusdz::Model>::type_name_abi_cxx11_();
    _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_49a8);
    ::std::__cxx11::string::_M_dispose();
    if (!_Var4) {
      tinyusdz::value::TypeTraits<tinyusdz::Scope>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        Scope::Scope((Scope *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::Scope>(this,&spec,node,psmap_00,(Scope *)local_49a8);
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)local_3fa0,meta);
          ::std::__cxx11::string::_M_assign((string *)(local_41e8 + 0x218));
          local_3fb0[0] = (string)(undefined1)spec;
          local_3fb0[1] = (string)spec._1_1_;
          local_3fb0[2] = (string)spec._2_1_;
          local_3fb0[3] = (string)spec._3_1_;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_38a0,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&local_38b8,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::Scope_const&>((any *)&local_4d18,(Scope *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x722);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        Scope::~Scope((Scope *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomMesh>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        GeomMesh::GeomMesh((GeomMesh *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::GeomMesh>(this,&spec,node,psmap_00,(GeomMesh *)local_49a8)
        ;
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::GeomMesh_const&>((any *)&local_4d18,(GeomMesh *)local_49a8)
          ;
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x723);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomMesh::~GeomMesh((GeomMesh *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomPoints>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        GeomPoints::GeomPoints((GeomPoints *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::GeomPoints>
                          (this,&spec,node,psmap_00,(GeomPoints *)local_49a8);
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::GeomPoints_const&>
                    ((any *)&local_4d18,(GeomPoints *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x724);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomPoints::~GeomPoints((GeomPoints *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomCylinder>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        GeomCylinder::GeomCylinder((GeomCylinder *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::GeomCylinder>
                          (this,&spec,node,psmap_00,(GeomCylinder *)local_49a8);
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::GeomCylinder_const&>
                    ((any *)&local_4d18,(GeomCylinder *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x725);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomCylinder::~GeomCylinder((GeomCylinder *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomCube>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        GeomCube::GeomCube((GeomCube *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::GeomCube>(this,&spec,node,psmap_00,(GeomCube *)local_49a8)
        ;
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::GeomCube_const&>((any *)&local_4d18,(GeomCube *)local_49a8)
          ;
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x726);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomCube::~GeomCube((GeomCube *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomCone>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        GeomCone::GeomCone((GeomCone *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::GeomCone>(this,&spec,node,psmap_00,(GeomCone *)local_49a8)
        ;
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::GeomCone_const&>((any *)&local_4d18,(GeomCone *)local_49a8)
          ;
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x727);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomCone::~GeomCone((GeomCone *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomSphere>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        GeomSphere::GeomSphere((GeomSphere *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::GeomSphere>
                          (this,&spec,node,psmap_00,(GeomSphere *)local_49a8);
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::GeomSphere_const&>
                    ((any *)&local_4d18,(GeomSphere *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x728);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomSphere::~GeomSphere((GeomSphere *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomCapsule>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        GeomCapsule::GeomCapsule((GeomCapsule *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::GeomCapsule>
                          (this,&spec,node,psmap_00,(GeomCapsule *)local_49a8);
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::GeomCapsule_const&>
                    ((any *)&local_4d18,(GeomCapsule *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x729);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomCapsule::~GeomCapsule((GeomCapsule *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomBasisCurves>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        GeomBasisCurves::GeomBasisCurves((GeomBasisCurves *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::GeomBasisCurves>
                          (this,&spec,node,psmap_00,(GeomBasisCurves *)local_49a8);
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::GeomBasisCurves_const&>
                    ((any *)&local_4d18,(GeomBasisCurves *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x72a);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomBasisCurves::~GeomBasisCurves((GeomBasisCurves *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomNurbsCurves>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        GeomNurbsCurves::GeomNurbsCurves((GeomNurbsCurves *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::GeomNurbsCurves>
                          (this,&spec,node,psmap_00,(GeomNurbsCurves *)local_49a8);
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::GeomNurbsCurves_const&>
                    ((any *)&local_4d18,(GeomNurbsCurves *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x72b);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomNurbsCurves::~GeomNurbsCurves((GeomNurbsCurves *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::PointInstancer>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        PointInstancer::PointInstancer((PointInstancer *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::PointInstancer>
                          (this,&spec,node,psmap_00,(PointInstancer *)local_49a8);
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::PointInstancer_const&>
                    ((any *)&local_4d18,(PointInstancer *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x72c);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        PointInstancer::~PointInstancer((PointInstancer *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomCamera>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        GeomCamera::GeomCamera((GeomCamera *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::GeomCamera>
                          (this,&spec,node,psmap_00,(GeomCamera *)local_49a8);
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),meta);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2b88,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_2c68 + 200)
                     ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::GeomCamera_const&>
                    ((any *)&local_4d18,(GeomCamera *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x72d);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomCamera::~GeomCamera((GeomCamera *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomSubset>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        GeomSubset::GeomSubset((GeomSubset *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::GeomSubset>
                          (this,&spec,node,psmap_00,(GeomSubset *)local_49a8);
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)local_3868,meta);
          ::std::__cxx11::string::_M_assign((string *)(local_41e8 + 0x218));
          local_3fb0[0] = (string)(undefined1)spec;
          local_3fb0[1] = (string)spec._1_1_;
          local_3fb0[2] = (string)spec._2_1_;
          local_3fb0[3] = (string)spec._3_1_;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_3458,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&local_3470,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::GeomSubset_const&>
                    ((any *)&local_4d18,(GeomSubset *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x72e);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomSubset::~GeomSubset((GeomSubset *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::SphereLight>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        SphereLight::SphereLight((SphereLight *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::SphereLight>
                          (this,&spec,node,psmap_00,(SphereLight *)local_49a8);
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)local_2c68,meta);
          ::std::__cxx11::string::_M_assign(local_48c0);
          local_48c0[0x20] = (string)(undefined1)spec;
          local_48c0[0x21] = (string)spec._1_1_;
          local_48c0[0x22] = (string)spec._2_1_;
          local_48c0[0x23] = (string)spec._3_1_;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2858,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&local_2870,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::SphereLight_const&>
                    ((any *)&local_4d18,(SphereLight *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x72f);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        SphereLight::~SphereLight((SphereLight *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::DomeLight>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        DomeLight::DomeLight((DomeLight *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::DomeLight>
                          (this,&spec,node,psmap_00,(DomeLight *)local_49a8);
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)local_2ee0,meta);
          ::std::__cxx11::string::_M_assign(local_48c0);
          local_48c0[0x20] = (string)(undefined1)spec;
          local_48c0[0x21] = (string)spec._1_1_;
          local_48c0[0x22] = (string)spec._2_1_;
          local_48c0[0x23] = (string)spec._3_1_;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2ad0,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&local_2ae8,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::DomeLight_const&>
                    ((any *)&local_4d18,(DomeLight *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x730);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        DomeLight::~DomeLight((DomeLight *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::CylinderLight>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        CylinderLight::CylinderLight((CylinderLight *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::CylinderLight>
                          (this,&spec,node,psmap_00,(CylinderLight *)local_49a8);
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)local_2c68,meta);
          ::std::__cxx11::string::_M_assign(local_48c0);
          local_48c0[0x20] = (string)(undefined1)spec;
          local_48c0[0x21] = (string)spec._1_1_;
          local_48c0[0x22] = (string)spec._2_1_;
          local_48c0[0x23] = (string)spec._3_1_;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2858,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&local_2870,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::CylinderLight_const&>
                    ((any *)&local_4d18,(CylinderLight *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x731);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        CylinderLight::~CylinderLight((CylinderLight *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::DiskLight>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        DiskLight::DiskLight((DiskLight *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::DiskLight>
                          (this,&spec,node,psmap_00,(DiskLight *)local_49a8);
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)local_2c68,meta);
          ::std::__cxx11::string::_M_assign(local_48c0);
          local_48c0[0x20] = (string)(undefined1)spec;
          local_48c0[0x21] = (string)spec._1_1_;
          local_48c0[0x22] = (string)spec._2_1_;
          local_48c0[0x23] = (string)spec._3_1_;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2858,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&local_2870,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::DiskLight_const&>
                    ((any *)&local_4d18,(DiskLight *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x732);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        DiskLight::~DiskLight((DiskLight *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::DistantLight>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        DistantLight::DistantLight((DistantLight *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::DistantLight>
                          (this,&spec,node,psmap_00,(DistantLight *)local_49a8);
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)local_2ee0,meta);
          ::std::__cxx11::string::_M_assign(local_48c0);
          local_48c0[0x20] = (string)(undefined1)spec;
          local_48c0[0x21] = (string)spec._1_1_;
          local_48c0[0x22] = (string)spec._2_1_;
          local_48c0[0x23] = (string)spec._3_1_;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2ad0,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&local_2ae8,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::DistantLight_const&>
                    ((any *)&local_4d18,(DistantLight *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x733);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        DistantLight::~DistantLight((DistantLight *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::SkelRoot>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        SkelRoot::SkelRoot((SkelRoot *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::SkelRoot>(this,&spec,node,psmap_00,(SkelRoot *)local_49a8)
        ;
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)local_3df0,meta);
          ::std::__cxx11::string::_M_assign(local_4908);
          local_48e8[0]._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_39e0,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     (local_3a58 + 0x60),
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::SkelRoot_const&>((any *)&local_4d18,(SkelRoot *)local_49a8)
          ;
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x734);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        SkelRoot::~SkelRoot((SkelRoot *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::Skeleton>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        Skeleton::Skeleton((Skeleton *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::Skeleton>(this,&spec,node,psmap_00,(Skeleton *)local_49a8)
        ;
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)local_31a0,meta);
          ::std::__cxx11::string::_M_assign(local_4908);
          local_48e8[0]._0_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_2d90,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     (local_2ee0 + 0x138),
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::Skeleton_const&>((any *)&local_4d18,(Skeleton *)local_49a8)
          ;
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x735);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        Skeleton::~Skeleton((Skeleton *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::SkelAnimation>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        SkelAnimation::SkelAnimation((SkelAnimation *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::SkelAnimation>
                          (this,&spec,node,psmap_00,(SkelAnimation *)local_49a8);
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)local_3a58,meta);
          ::std::__cxx11::string::_M_assign((string *)local_49a8);
          local_49a8._32_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_3648,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     (local_3868 + 0x208),
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::SkelAnimation_const&>
                    ((any *)&local_4d18,(SkelAnimation *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x736);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        SkelAnimation::~SkelAnimation((SkelAnimation *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::BlendShape>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        BlendShape::BlendShape((BlendShape *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::BlendShape>
                          (this,&spec,node,psmap_00,(BlendShape *)local_49a8);
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)local_41e8,meta);
          ::std::__cxx11::string::_M_assign((string *)local_49a8);
          local_49a8._32_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     (local_3df0 + 0x18),
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_3df0,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::BlendShape_const&>
                    ((any *)&local_4d18,(BlendShape *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x737);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        BlendShape::~BlendShape((BlendShape *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::Shader>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        Shader::Shader((Shader *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::Shader>(this,&spec,node,psmap_00,(Shader *)local_49a8);
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)(local_49a8 + 0x30),meta);
          ::std::__cxx11::string::_M_assign((string *)local_49a8);
          local_49a8._32_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_4290,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&local_42a8,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::Shader_const&>((any *)&local_4d18,(Shader *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x738);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        Shader::~Shader((Shader *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::Material>::type_name_abi_cxx11_();
      _Var4 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var4) {
        Material::Material((Material *)local_49a8);
        bVar3 = ReconstructPrim<tinyusdz::Material>(this,&spec,node,psmap_00,(Material *)local_49a8)
        ;
        if (bVar3) {
          PrimMetas::operator=((PrimMetas *)(local_49a8 + 0x30),meta);
          ::std::__cxx11::string::_M_assign((string *)local_49a8);
          local_49a8._32_4_ = spec;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (local_4290,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
          pvVar1 = primChildren;
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&local_42a8,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren);
          linb::any::construct<tinyusdz::Material_const&>((any *)&local_4d18,(Material *)local_49a8)
          ;
          Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          pPVar6 = Prim::metas((Prim *)local_4cf8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    (&pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d18.field_2._M_allocated_capacity != 0) {
            (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x739);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
          poVar5 = ::std::operator<<(poVar5,(string *)typeName);
          poVar5 = ::std::operator<<(poVar5," elementName: ");
          poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_4d18);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        Material::~Material((Material *)local_49a8);
        return __return_storage_ptr__;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_49a8);
      poVar5 = ::std::operator<<((ostream *)local_49a8,"[warn]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x73a);
      ::std::operator<<(poVar5," ");
      poVar5 = ::std::operator<<((ostream *)local_49a8,"TODO or unsupported prim type: ");
      poVar5 = ::std::operator<<(poVar5,(string *)typeName);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::stringbuf::str();
      PushWarn(this,(string *)local_4cf8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_49a8);
      if (pbVar2 != (bool *)0x0) {
        *pbVar2 = true;
      }
      __return_storage_ptr__->has_value_ = false;
      memset(&__return_storage_ptr__->contained,0,0x350);
      return __return_storage_ptr__;
    }
    Model::Model((Model *)local_49a8);
    bVar3 = ReconstructPrim<tinyusdz::Model>(this,&spec,node,psmap_00,(Model *)local_49a8);
    if (!bVar3) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
      poVar5 = ::std::operator<<((ostream *)local_4cf8,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ReconstructPrimFromTypeName");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x721);
      ::std::operator<<(poVar5," ");
      poVar5 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim ");
      poVar5 = ::std::operator<<(poVar5,(string *)typeName);
      poVar5 = ::std::operator<<(poVar5," elementName: ");
      poVar5 = ::std::operator<<(poVar5,(string *)prim_name);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_4d18);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
LAB_00151f60:
      __return_storage_ptr__->has_value_ = false;
      memset(&__return_storage_ptr__->contained,0,0x350);
      goto LAB_00152185;
    }
    PrimMetas::operator=((PrimMetas *)local_3f80,meta);
    ::std::__cxx11::string::_M_assign((string *)(local_41e8 + 0x218));
    local_3fa0._16_4_ = spec;
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              (local_3b00,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)properties);
    pvVar1 = primChildren;
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              (&local_3b18,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)primChildren
              );
    linb::any::construct<tinyusdz::Model_const&>((any *)&local_4d18,(Model *)local_49a8);
    Prim::Prim((Prim *)local_4cf8,prim_name,(Value *)&local_4d18);
    ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
    pPVar6 = Prim::metas((Prim *)local_4cf8);
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              (&pPVar6->primChildren,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
  }
  nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
            (__return_storage_ptr__,(Prim *)local_4cf8);
  Prim::~Prim((Prim *)local_4cf8);
  if (local_4d18.field_2._M_allocated_capacity != 0) {
    (**(code **)(local_4d18.field_2._M_allocated_capacity + 0x20))(&local_4d18);
  }
LAB_00152185:
  Model::~Model((Model *)local_49a8);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<Prim> USDCReader::Impl::ReconstructPrimFromTypeName(
    const std::string &typeName, // TinyUSDZ's Prim type name
    const std::string &primTypeName, // USD's Prim typeName
    const std::string &prim_name,
    const crate::CrateReader::Node &node, const Specifier spec,
    const std::vector<value::token> &primChildren,
    const std::vector<value::token> &properties,
    const PathIndexToSpecIndexMap &psmap, const PrimMeta &meta, bool *is_unsupported_prim) {

  if (is_unsupported_prim) {
    (*is_unsupported_prim) = false; // init with false
  }


#define RECONSTRUCT_PRIM(__primty, __node_ty, __prim_name, __spec) \
  if (__node_ty == value::TypeTraits<__primty>::type_name()) {     \
    __primty typed_prim;                                           \
    if (!ReconstructPrim(__spec, node, psmap, &typed_prim)) {         \
      PUSH_ERROR("Failed to reconstruct Prim " << __node_ty << " elementName: " << __prim_name);      \
      return nonstd::nullopt;                                      \
    }                                                              \
    typed_prim.meta = meta;                                        \
    typed_prim.name = __prim_name;                                 \
    typed_prim.spec = __spec;                                      \
    typed_prim.propertyNames() = properties; \
    typed_prim.primChildrenNames() = primChildren; \
    value::Value primdata = typed_prim;                            \
    Prim prim(__prim_name, primdata);                            \
    prim.prim_type_name() = primTypeName; \
    /* also add primChildren to Prim */ \
    prim.metas().primChildren = primChildren; \
    return std::move(prim); \
  }